

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O0

tadsobj_objid_and_ptr * __thiscall CVmObjTadsInhQueue::create_path(CVmObjTadsInhQueue *this)

{
  tadsobj_objid_and_ptr *ptVar1;
  undefined8 *in_RDI;
  tadsobj_objid_and_ptr *dst;
  tadsobj_objid_and_ptr *path;
  pfq_ele *cur;
  int cnt;
  tadsobj_objid_and_ptr *local_28;
  vm_obj_id_t *local_18;
  int local_c;
  
  local_c = 0;
  for (local_18 = (vm_obj_id_t *)*in_RDI; local_18 != (vm_obj_id_t *)0x0;
      local_18 = *(vm_obj_id_t **)(local_18 + 4)) {
    if (*local_18 != 0) {
      local_c = local_c + 1;
    }
  }
  ptVar1 = (tadsobj_objid_and_ptr *)malloc((long)(local_c + 1) << 4);
  local_28 = ptVar1;
  for (local_18 = (vm_obj_id_t *)*in_RDI; local_18 != (vm_obj_id_t *)0x0;
      local_18 = *(vm_obj_id_t **)(local_18 + 4)) {
    if (*local_18 != 0) {
      local_28->id = *local_18;
      local_28->objp = *(CVmObjTads **)(local_18 + 2);
      local_28 = local_28 + 1;
    }
  }
  local_28->id = 0;
  local_28->objp = (CVmObjTads *)0x0;
  return ptVar1;
}

Assistant:

tadsobj_objid_and_ptr *create_path() const
    {
        /* count the elements in the queue */
        int cnt;
        pfq_ele *cur;
        for (cnt = 0, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only non-nil elements count */
            if (cur->obj != VM_INVALID_OBJ)
                ++cnt;
        }

        /* allocate the path */
        tadsobj_objid_and_ptr *path = (tadsobj_objid_and_ptr *)t3malloc(
            (cnt + 1) * sizeof(tadsobj_objid_and_ptr));

        /* initialize the path */
        tadsobj_objid_and_ptr *dst;
        for (dst = path, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only store non-nil elements */
            if (cur->obj != VM_INVALID_OBJ)
            {
                dst->id = cur->obj;
                dst->objp = cur->objp;
                ++dst;
            }
        }

        /* set the null last entry */
        dst->id = VM_INVALID_OBJ;
        dst->objp = 0;

        /* return the new path */
        return path;
    }